

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O3

void Gli_ManPrintObjects(Gli_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < p->nObjData) {
    uVar3 = 0;
    do {
      if (p->pObjData == (int *)0x0) {
        return;
      }
      puVar1 = (uint *)(p->pObjData + uVar3);
      printf("Node %d \n",(ulong)puVar1[1]);
      printf("Fanins: ");
      if ((*puVar1 & 0x70) != 0) {
        uVar4 = 0;
        do {
          printf("%d ",(ulong)puVar1[1 - (long)(int)puVar1[uVar4 + 7]]);
          uVar4 = uVar4 + 1;
        } while (uVar4 < (*puVar1 >> 4 & 7));
      }
      putchar(10);
      printf("Fanouts: ");
      uVar2 = *puVar1;
      if (0x7f < uVar2) {
        lVar5 = 0;
        do {
          printf("%d ",(ulong)puVar1[(long)(int)puVar1[(ulong)(uVar2 >> 4 & 7) + lVar5 + 7] + 1]);
          uVar2 = *puVar1;
          lVar5 = lVar5 + 1;
        } while ((uint)lVar5 < uVar2 >> 7);
      }
      putchar(10);
      uVar2 = (int)uVar3 + (*puVar1 >> 7) + (*puVar1 >> 4 & 7) + 7;
      uVar3 = (ulong)uVar2;
    } while ((int)uVar2 < p->nObjData);
  }
  return;
}

Assistant:

void Gli_ManPrintObjects( Gli_Man_t * p )
{
    Gli_Obj_t * pObj, * pNext;
    int i, k;
    Gli_ManForEachObj( p, pObj, i )
    {
        printf( "Node %d \n", pObj->Handle );
        printf( "Fanins: " );
        Gli_ObjForEachFanin( pObj, pNext, k )
            printf( "%d ", pNext->Handle );
        printf( "\n" );
        printf( "Fanouts: " );
        Gli_ObjForEachFanout( pObj, pNext, k )
            printf( "%d ", pNext->Handle );
        printf( "\n" );
    }
}